

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS ref_egads_construct(REF_GEOM ref_geom,char *description)

{
  printf("nothing for %s, Full EGADS not linked for %s\n","ref_egads_construct",description);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_construct(REF_GEOM ref_geom,
                                       const char *description) {
#if defined(HAVE_EGADS) && !defined(HAVE_EGADS_LITE)
  ego body = NULL;

  RAS(ref_egads_allows_construction(), "construction not allowed");

  if (0 == strcmp("cylinder", description)) {
    int stype = CYLINDER;
    double data[7] = {0.0, 0.0, 0.0, 1.0, 0.0, 0.0, 1.0};
    REIS(EGADS_SUCCESS,
         EG_makeSolidBody((ego)(ref_geom->context), stype, data, &body),
         "make solid body");
  }
  if (0 == strcmp("sphere", description)) {
    int stype = SPHERE;
    double data[4] = {0.0, 0.0, 0.0, 1.0};
    REIS(EGADS_SUCCESS,
         EG_makeSolidBody((ego)(ref_geom->context), stype, data, &body),
         "make solid body");
  }
  if (0 == strcmp("boxbox", description)) {
    int stype = BOX;
    ego box1, box2;
    {
      double data[6] = {0.0, 0.0, 0.0, 1.0, 1.0, 0.5};
      REIS(EGADS_SUCCESS,
           EG_makeSolidBody((ego)(ref_geom->context), stype, data, &box1),
           "make solid body");
    }
    {
      double data[6] = {0.0, 0.0, 0.5, 1.0, 1.0, 0.5};
      REIS(EGADS_SUCCESS,
           EG_makeSolidBody((ego)(ref_geom->context), stype, data, &box2),
           "make solid body");
    }
    {
      ego boxbox, geom, *bodies;
      int oclass, nego, nbody, *senses;
      REIS(EGADS_SUCCESS, EG_generalBoolean(box1, box2, FUSION, 0.0, &boxbox),
           "make solid body");
      REIS(EGADS_SUCCESS,
           EG_getTopology(boxbox, &geom, &oclass, &nego, NULL, &nbody, &bodies,
                          &senses),
           "EG topo bodies");
      REIS(1, nbody, "expected 1 body");
      REIS(EGADS_SUCCESS, EG_copyObject(bodies[0], NULL, &body), "copy body");
      REIS(0, EG_deleteObject(boxbox), "delete temp model");
      REIS(0, EG_deleteObject(box1), "delete box1");
      REIS(0, EG_deleteObject(box2), "delete box2");
    }
  }
  if (0 == strcmp("steinmetz", description)) {
    int stype = CYLINDER;
    ego cyl1, cyl2;
    {
      double data[7] = {-1.0, 0.0, 0.0, 1.0, 0.0, 0.0, 1.0};
      REIS(EGADS_SUCCESS,
           EG_makeSolidBody((ego)(ref_geom->context), stype, data, &cyl1),
           "make solid body");
    }
    {
      double data[7] = {0.0, -1.0, 0.0, 0.0, 1.0, 0.0, 1.0};
      REIS(EGADS_SUCCESS,
           EG_makeSolidBody((ego)(ref_geom->context), stype, data, &cyl2),
           "make solid body");
    }
    {
      ego stein, geom, *bodies;
      int oclass, nego, nbody, *senses;
      REIS(EGADS_SUCCESS,
           EG_generalBoolean(cyl1, cyl2, INTERSECTION, 0.0, &stein),
           "make solid body");
      REIS(EGADS_SUCCESS,
           EG_getTopology(stein, &geom, &oclass, &nego, NULL, &nbody, &bodies,
                          &senses),
           "EG topo bodies");
      REIS(1, nbody, "expected 1 body");
      REIS(EGADS_SUCCESS, EG_copyObject(bodies[0], NULL, &body), "copy body");
      REIS(0, EG_deleteObject(stein), "delete temp model");
      REIS(0, EG_deleteObject(cyl1), "delete cyl1");
      REIS(0, EG_deleteObject(cyl2), "delete cyl2");
    }
  }
  if (0 == strcmp("square", description)) {
    ego nodes[4], curves[4], edges[4];
    { /* nodes */
      double xyz[3];
      xyz[0] = 0;
      xyz[1] = 0;
      xyz[2] = 0;
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, NODE, 0, xyz, 0,
                           NULL, NULL, &nodes[0]),
           "make node");
      xyz[0] = 1;
      xyz[1] = 0;
      xyz[2] = 0;
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, NODE, 0, xyz, 0,
                           NULL, NULL, &nodes[1]),
           "make node");
      xyz[0] = 1;
      xyz[1] = 1;
      xyz[2] = 0;
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, NODE, 0, xyz, 0,
                           NULL, NULL, &nodes[2]),
           "make node");
      xyz[0] = 0;
      xyz[1] = 1;
      xyz[2] = 0;
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, NODE, 0, xyz, 0,
                           NULL, NULL, &nodes[3]),
           "make node");
    }

    { /* curves */
      ego ref, *pchldrn;
      int oclass, mtype, nchild, *psens;
      double data[6];
      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[0], &ref, &oclass, &mtype, &(data[0]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[1], &ref, &oclass, &mtype, &(data[3]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      data[3] -= data[0];
      data[4] -= data[1];
      data[5] -= data[2];
      REIS(EGADS_SUCCESS,
           EG_makeGeometry((ego)(ref_geom->context), CURVE, LINE, NULL, NULL,
                           data, &curves[0]),
           "line");

      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[1], &ref, &oclass, &mtype, &(data[0]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[2], &ref, &oclass, &mtype, &(data[3]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      data[3] -= data[0];
      data[4] -= data[1];
      data[5] -= data[2];
      REIS(EGADS_SUCCESS,
           EG_makeGeometry((ego)(ref_geom->context), CURVE, LINE, NULL, NULL,
                           data, &curves[1]),
           "line");

      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[2], &ref, &oclass, &mtype, &(data[0]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[3], &ref, &oclass, &mtype, &(data[3]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      data[3] -= data[0];
      data[4] -= data[1];
      data[5] -= data[2];
      REIS(EGADS_SUCCESS,
           EG_makeGeometry((ego)(ref_geom->context), CURVE, LINE, NULL, NULL,
                           data, &curves[2]),
           "line");

      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[3], &ref, &oclass, &mtype, &(data[0]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS,
           EG_getTopology(nodes[0], &ref, &oclass, &mtype, &(data[3]), &nchild,
                          &pchldrn, &psens),
           "node xyz");
      data[3] -= data[0];
      data[4] -= data[1];
      data[5] -= data[2];
      REIS(EGADS_SUCCESS,
           EG_makeGeometry((ego)(ref_geom->context), CURVE, LINE, NULL, NULL,
                           data, &curves[3]),
           "line");
    }

    { /* edges */
      ego ref, *pchldrn, objs[2];
      int oclass, mtype, nchild, *psens;
      double xyz[3], dum[3], range[2];
      objs[0] = nodes[0];
      objs[1] = nodes[1];
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[0], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[0], xyz, &range[0], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[1], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[0], xyz, &range[1], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), curves[0], EDGE, TWONODE,
                           range, 2, objs, NULL, &edges[0]),
           "make edge");

      objs[0] = nodes[1];
      objs[1] = nodes[2];
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[0], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[1], xyz, &range[0], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[1], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[1], xyz, &range[1], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), curves[1], EDGE, TWONODE,
                           range, 2, objs, NULL, &edges[1]),
           "make edge");

      objs[0] = nodes[2];
      objs[1] = nodes[3];
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[0], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[2], xyz, &range[0], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[1], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[2], xyz, &range[1], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), curves[2], EDGE, TWONODE,
                           range, 2, objs, NULL, &edges[2]),
           "make edge");

      objs[0] = nodes[3];
      objs[1] = nodes[0];
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[0], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[3], xyz, &range[0], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_getTopology(objs[1], &ref, &oclass, &mtype, xyz, &nchild,
                          &pchldrn, &psens),
           "node xyz");
      REIS(EGADS_SUCCESS, EG_invEvaluate(curves[3], xyz, &range[1], dum),
           "trange");
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), curves[3], EDGE, TWONODE,
                           range, 2, objs, NULL, &edges[3]),
           "make edge");
    }

    { /* loop and face */
      int senses[4] = {1, 1, 1, 1};
      ego loop, face;
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, LOOP, CLOSED, NULL,
                           4, edges, senses, &loop),
           "make loop");
      REIS(EGADS_SUCCESS, EG_makeFace(loop, SREVERSE, NULL, &face), "face");
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, BODY, FACEBODY, NULL,
                           1, &face, NULL, &body),
           "facebody");
      REIS(0, EG_deleteObject((ego)(ref_geom->context)),
           "delete construction objects");
    }
  }
  if (0 == strcmp("revolve", description)) {
    ego face;
    double data[6];
    RSS(ref_egads_construct(ref_geom, "square"), "create");
    REIS(EGADS_SUCCESS, EG_copyObject((ego)(ref_geom->body), NULL, &face),
         "copy body");
    REIS(0, EG_deleteObject((ego)(ref_geom->model)), "delete body model");

    data[0] = 0.0;
    data[1] = 0.0;
    data[2] = 0.0;
    data[3] = 1.0;
    data[4] = 0.0;
    data[5] = 0.0;
    REIS(EGADS_SUCCESS, EG_rotate(face, 360.0, data, &body), "revolve");
    REIS(0, EG_deleteObject((ego)(ref_geom->context)),
         "delete construction objects");
  }
  RNB(body, "unknown description", { printf(">%s<\n", description); });
  {
    ego model;
    REIS(EGADS_SUCCESS,
         EG_makeTopology((ego)(ref_geom->context), NULL, MODEL, 0, NULL, 1,
                         &body, NULL, &model),
         "make Topo Model");
    ref_geom->model = (void *)model;
  }
  ref_geom->body = (void *)body;
  {
    ego geom, *children;
    int oclass, mtype, *senses, nchild;
    REIS(EGADS_SUCCESS,
         EG_getTopology(body, &geom, &oclass, &mtype, NULL, &nchild, &children,
                        &senses),
         "EG topo body type");
    ref_geom->manifold = (SOLIDBODY == mtype);
  }

  RSS(ref_egads_cache_body_objects(ref_geom), "cache egads objects");

#else
  printf("nothing for %s, Full EGADS not linked for %s\n", __func__,
         description);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
#endif
  return REF_SUCCESS;
}